

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O1

void __thiscall QPDF::parse(QPDF *this,char *password)

{
  char *pcVar1;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var2;
  long *plVar3;
  bool bVar4;
  long lVar5;
  longlong xref_offset;
  QPDFExc *pQVar6;
  long offset;
  PatternFinder sf;
  PatternFinder hf;
  string local_150;
  string local_130;
  string local_110;
  undefined1 local_f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  undefined1 local_d0 [16];
  undefined1 local_c0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78 [2];
  Finder local_50;
  QPDF *local_48;
  code *local_40;
  undefined8 local_38;
  
  if (password != (char *)0x0) {
    lVar5 = *(long *)&(((this->m)._M_t.
                        super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                        .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->encp).
                      super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>;
    pcVar1 = *(char **)(lVar5 + 0x58);
    strlen(password);
    std::__cxx11::string::_M_replace(lVar5 + 0x50,0,pcVar1,(ulong)password);
  }
  local_50._vptr_Finder = (_func_int **)&PTR__Finder_002f2b38;
  local_40 = findHeader;
  local_38 = 0;
  local_48 = this;
  bVar4 = InputSource::findFirst
                    ((((this->m)._M_t.
                       super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                     super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr,"%PDF-",0,
                     0x400,&local_50);
  if (!bVar4) {
    local_f0._0_8_ = &local_e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"");
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_150,"can\'t find PDF header","");
    damagedPDF((QPDFExc *)local_d0,this,(string *)local_f0,-1,&local_150);
    warn(this,(QPDFExc *)local_d0);
    QPDFExc::~QPDFExc((QPDFExc *)local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._0_8_ != &local_e0) {
      operator_delete((void *)local_f0._0_8_,local_e0._M_allocated_capacity + 1);
    }
    _Var2._M_head_impl =
         (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
         _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    std::__cxx11::string::_M_replace
              ((ulong)&(_Var2._M_head_impl)->pdf_version,0,
               *(char **)((long)&(_Var2._M_head_impl)->pdf_version + 8),0x27d3b3);
  }
  plVar3 = *(long **)&(((this->m)._M_t.
                        super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                        .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                      super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>;
  (**(code **)(*plVar3 + 0x28))(plVar3,0,2);
  lVar5 = (**(code **)(**(long **)&(((this->m)._M_t.
                                     super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                     .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
                                   file).super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>
                      + 0x20))();
  _Var2._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  (_Var2._M_head_impl)->xref_table_max_offset = lVar5;
  if (lVar5 / 3 < (long)(_Var2._M_head_impl)->xref_table_max_id) {
    (_Var2._M_head_impl)->xref_table_max_id = (int)(lVar5 / 3);
  }
  offset = lVar5 + -0x41e;
  if (lVar5 < 0x41f) {
    offset = 0;
  }
  local_f0._0_8_ = &PTR__Finder_002f2b38;
  local_e0._M_allocated_capacity = (size_type)findStartxref;
  local_e0._8_8_ = 0;
  local_f0._8_8_ = this;
  bVar4 = InputSource::findLast
                    (((_Var2._M_head_impl)->file).
                     super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr,"startxref",
                     offset,0,(Finder *)local_f0);
  if (bVar4) {
    _Var2._M_head_impl =
         (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
         _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    ::qpdf::Tokenizer::readToken
              ((Token *)local_d0,&(_Var2._M_head_impl)->tokenizer,
               ((_Var2._M_head_impl)->file).
               super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &(_Var2._M_head_impl)->last_object_description,true,0);
    xref_offset = QUtil::string_to_ll((char *)local_d0._8_8_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_allocated_capacity != local_78) {
      operator_delete((void *)local_88._M_allocated_capacity,local_78[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_allocated_capacity != &local_98) {
      operator_delete((void *)local_a8._M_allocated_capacity,
                      (ulong)(local_98._M_allocated_capacity + 1));
    }
    if ((undefined1 *)local_d0._8_8_ != local_c0 + 8) {
      operator_delete((void *)local_d0._8_8_,(ulong)(local_c0._8_8_ + 1));
    }
  }
  else {
    xref_offset = 0;
  }
  if (xref_offset != 0) {
    read_xref(this,xref_offset);
    initializeEncryption(this);
    _Var2._M_head_impl =
         (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
         _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    (_Var2._M_head_impl)->parsed = true;
    if (*(size_t *)((long)&(_Var2._M_head_impl)->xref_table + 0x28) == 0) {
      bVar4 = false;
    }
    else {
      getRoot((QPDF *)&local_110);
      local_d0._0_8_ = local_c0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"/Pages","");
      QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_110.field_2,&local_110);
      bVar4 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)&local_110.field_2);
      bVar4 = !bVar4;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110.field_2._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110.field_2._8_8_);
      }
      if ((undefined1 *)local_d0._0_8_ != local_c0) {
        operator_delete((void *)local_d0._0_8_,local_c0._0_8_ + 1);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._M_string_length);
      }
    }
    if (bVar4) {
      pQVar6 = (QPDFExc *)__cxa_allocate_exception(0x80);
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"");
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_130,"unable to find page tree","");
      damagedPDF(pQVar6,this,&local_150,-1,&local_130);
      __cxa_throw(pQVar6,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
    return;
  }
  pQVar6 = (QPDFExc *)__cxa_allocate_exception(0x80);
  local_d0._0_8_ = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"");
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"can\'t find startxref","");
  damagedPDF(pQVar6,this,(string *)local_d0,-1,&local_150);
  __cxa_throw(pQVar6,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
}

Assistant:

void
QPDF::parse(char const* password)
{
    if (password) {
        m->encp->provided_password = password;
    }

    // Find the header anywhere in the first 1024 bytes of the file.
    PatternFinder hf(*this, &QPDF::findHeader);
    if (!m->file->findFirst("%PDF-", 0, 1024, hf)) {
        QTC::TC("qpdf", "QPDF not a pdf file");
        warn(damagedPDF("", -1, "can't find PDF header"));
        // QPDFWriter writes files that usually require at least version 1.2 for /FlateDecode
        m->pdf_version = "1.2";
    }

    // PDF spec says %%EOF must be found within the last 1024 bytes of/ the file.  We add an extra
    // 30 characters to leave room for the startxref stuff.
    m->file->seek(0, SEEK_END);
    qpdf_offset_t end_offset = m->file->tell();
    m->xref_table_max_offset = end_offset;
    // Sanity check on object ids. All objects must appear in xref table / stream. In all realistic
    // scenarios at least 3 bytes are required.
    if (m->xref_table_max_id > m->xref_table_max_offset / 3) {
        m->xref_table_max_id = static_cast<int>(m->xref_table_max_offset / 3);
    }
    qpdf_offset_t start_offset = (end_offset > 1054 ? end_offset - 1054 : 0);
    PatternFinder sf(*this, &QPDF::findStartxref);
    qpdf_offset_t xref_offset = 0;
    if (m->file->findLast("startxref", start_offset, 0, sf)) {
        xref_offset = QUtil::string_to_ll(readToken(*m->file).getValue().c_str());
    }

    try {
        if (xref_offset == 0) {
            QTC::TC("qpdf", "QPDF can't find startxref");
            throw damagedPDF("", -1, "can't find startxref");
        }
        try {
            read_xref(xref_offset);
        } catch (QPDFExc&) {
            throw;
        } catch (std::exception& e) {
            throw damagedPDF("", -1, std::string("error reading xref: ") + e.what());
        }
    } catch (QPDFExc& e) {
        if (m->attempt_recovery) {
            reconstruct_xref(e, xref_offset > 0);
            QTC::TC("qpdf", "QPDF reconstructed xref table");
        } else {
            throw;
        }
    }

    initializeEncryption();
    m->parsed = true;
    if (m->xref_table.size() > 0 && !getRoot().getKey("/Pages").isDictionary()) {
        // QPDFs created from JSON have an empty xref table and no root object yet.
        throw damagedPDF("", -1, "unable to find page tree");
    }
}